

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Table<unsigned_int,_kj::InsertionOrderIndex> * __thiscall
kj::_::NullableValue<kj::Table<unsigned_int,kj::InsertionOrderIndex>>::
emplace<kj::Table<unsigned_int,kj::InsertionOrderIndex>>
          (NullableValue<kj::Table<unsigned_int,kj::InsertionOrderIndex>> *this,
          Table<unsigned_int,_kj::InsertionOrderIndex> *params)

{
  Table<unsigned_int,_kj::InsertionOrderIndex> *params_00;
  Table<unsigned_int,_kj::InsertionOrderIndex> *params_local;
  NullableValue<kj::Table<unsigned_int,_kj::InsertionOrderIndex>_> *this_local;
  
  if (((byte)*this & 1) != 0) {
    *this = (NullableValue<kj::Table<unsigned_int,kj::InsertionOrderIndex>>)0x0;
    dtor<kj::Table<unsigned_int,kj::InsertionOrderIndex>>
              ((Table<unsigned_int,_kj::InsertionOrderIndex> *)(this + 8));
  }
  params_00 = fwd<kj::Table<unsigned_int,kj::InsertionOrderIndex>>(params);
  ctor<kj::Table<unsigned_int,kj::InsertionOrderIndex>,kj::Table<unsigned_int,kj::InsertionOrderIndex>>
            ((Table<unsigned_int,_kj::InsertionOrderIndex> *)(this + 8),params_00);
  *this = (NullableValue<kj::Table<unsigned_int,kj::InsertionOrderIndex>>)0x1;
  return (Table<unsigned_int,_kj::InsertionOrderIndex> *)(this + 8);
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }